

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O2

void __thiscall
Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage
          (D3MFOpcPackage *this,IOSystem *pIOHandler,string *rFile)

{
  unique_ptr<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_> *puVar1;
  ZipArchiveIOSystem *pZVar2;
  pointer pbVar3;
  bool bVar4;
  __type _Var5;
  char cVar6;
  ZipArchiveIOSystem *this_00;
  IOStream *pIVar7;
  Logger *pLVar8;
  DeadlyImportError *this_01;
  D3MFOpcPackage *this_02;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  string rootFile;
  
  puVar1 = &this->mZipArchive;
  this->mRootStream = (IOStream *)0x0;
  (this->mZipArchive)._M_t.
  super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl =
       (ZipArchiveIOSystem *)0x0;
  this_00 = (ZipArchiveIOSystem *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
  ZipArchiveIOSystem::ZipArchiveIOSystem(this_00,pIOHandler,rFile,"r");
  pZVar2 = (puVar1->_M_t).
           super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
           .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
  .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl = this_00;
  if (pZVar2 != (ZipArchiveIOSystem *)0x0) {
    (**(code **)((long)(pZVar2->super_IOSystem)._vptr_IOSystem + 8))();
    this_00 = (puVar1->_M_t).
              super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
              ._M_t.
              super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
              .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
  }
  bVar4 = ZipArchiveIOSystem::isOpen(this_00);
  if (!bVar4) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1e8,"Failed to open file ",rFile);
    std::operator+(&rootFile,&local_1e8,".");
    DeadlyImportError::DeadlyImportError(this_01,&rootFile);
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  fileList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fileList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fileList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ZipArchiveIOSystem::getFileList
            ((puVar1->_M_t).
             super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
             .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl,&fileList);
  pbVar3 = fileList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __lhs = fileList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == pbVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&fileList);
      return;
    }
    _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)XmlTag::ROOT_RELATIONSHIPS_ARCHIVE_abi_cxx11_);
    if (_Var5) {
      pZVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
      cVar6 = (**(code **)((long)(pZVar2->super_IOSystem)._vptr_IOSystem + 0x10))
                        (pZVar2,(__lhs->_M_dataplus)._M_p);
      if (cVar6 == '\0') {
        __assert_fail("mZipArchive->Exists(file.c_str())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                      ,0x87,
                      "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                     );
      }
      pZVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
      this_02 = (D3MFOpcPackage *)(__lhs->_M_dataplus)._M_p;
      pIVar7 = (IOStream *)
               (**(code **)((long)(pZVar2->super_IOSystem)._vptr_IOSystem + 0x20))
                         (pZVar2,this_02,"rb");
      if (pIVar7 == (IOStream *)0x0) {
        __assert_fail("fileStream != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                      ,0x8b,
                      "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                     );
      }
      ReadPackageRootRelationship_abi_cxx11_(&rootFile,this_02,pIVar7);
      if ((rootFile._M_string_length != 0) && (*rootFile._M_dataplus._M_p == '/')) {
        std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&rootFile);
        std::__cxx11::string::operator=((string *)&rootFile,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        if (*rootFile._M_dataplus._M_p == '/') {
          std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&rootFile);
          std::__cxx11::string::operator=((string *)&rootFile,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
      }
      pLVar8 = DefaultLogger::get();
      Logger::debug(pLVar8,rootFile._M_dataplus._M_p);
      pZVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
      (**(code **)((long)(pZVar2->super_IOSystem)._vptr_IOSystem + 0x28))(pZVar2,pIVar7);
      pZVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
               .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl;
      pIVar7 = (IOStream *)
               (**(code **)((long)(pZVar2->super_IOSystem)._vptr_IOSystem + 0x20))
                         (pZVar2,rootFile._M_dataplus._M_p,"rb");
      this->mRootStream = pIVar7;
      if (pIVar7 == (IOStream *)0x0) {
        __assert_fail("mRootStream != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/3MF/D3MFOpcPackage.cpp"
                      ,0x9b,
                      "Assimp::D3MF::D3MFOpcPackage::D3MFOpcPackage(IOSystem *, const std::string &)"
                     );
      }
      std::__cxx11::string::~string((string *)&rootFile);
    }
    else {
      _Var5 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)XmlTag::CONTENT_TYPES_ARCHIVE_abi_cxx11_);
      if (_Var5) {
        pLVar8 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[56]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&rootFile
                   ,(char (*) [56])"Ignored file of unsupported type CONTENT_TYPES_ARCHIVES");
        std::operator<<((ostream *)&rootFile,(string *)__lhs);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar8,local_1e8._M_dataplus._M_p);
      }
      else {
        pLVar8 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[31]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&rootFile
                   ,(char (*) [31])"Ignored file of unknown type: ");
        std::operator<<((ostream *)&rootFile,(string *)__lhs);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar8,local_1e8._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rootFile);
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

D3MFOpcPackage::D3MFOpcPackage(IOSystem* pIOHandler, const std::string& rFile)
: mRootStream(nullptr)
, mZipArchive() {    
    mZipArchive.reset( new ZipArchiveIOSystem( pIOHandler, rFile ) );
    if(!mZipArchive->isOpen()) {
        throw DeadlyImportError("Failed to open file " + rFile+ ".");
    }

    std::vector<std::string> fileList;
    mZipArchive->getFileList(fileList);

    for (auto& file: fileList) {
        if(file == D3MF::XmlTag::ROOT_RELATIONSHIPS_ARCHIVE) {
            //PkgRelationshipReader pkgRelReader(file, archive);
            ai_assert(mZipArchive->Exists(file.c_str()));

            IOStream *fileStream = mZipArchive->Open(file.c_str());

            ai_assert(fileStream != nullptr);

            std::string rootFile = ReadPackageRootRelationship(fileStream);
            if ( rootFile.size() > 0 && rootFile[ 0 ] == '/' ) {
                rootFile = rootFile.substr( 1 );
                if ( rootFile[ 0 ] == '/' ) {
                    // deal with zip-bug
                    rootFile = rootFile.substr( 1 );
                }
            }

            ASSIMP_LOG_DEBUG(rootFile);

            mZipArchive->Close(fileStream);

            mRootStream = mZipArchive->Open(rootFile.c_str());
            ai_assert( mRootStream != nullptr );
            if ( nullptr == mRootStream ) {
                throw DeadlyExportError( "Cannot open root-file in archive : " + rootFile );
            }

        } else if( file == D3MF::XmlTag::CONTENT_TYPES_ARCHIVE) {
            ASSIMP_LOG_WARN_F("Ignored file of unsupported type CONTENT_TYPES_ARCHIVES",file);
        } else {
            ASSIMP_LOG_WARN_F("Ignored file of unknown type: ",file);
        }

    }
}